

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini_processing.cpp
# Opt level: O3

void __thiscall IniProcessing::IniProcessing(IniProcessing *this,char *iniFileName,int param_2)

{
  int __oflag;
  allocator local_39;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  std::__cxx11::string::string((string *)this,iniFileName,(allocator *)local_38);
  (this->m_params).opened = false;
  (this->m_params).lineWithError = -1;
  (this->m_params).errorCode = ERR_OK;
  (this->m_params).modified = false;
  *(undefined8 *)&(this->m_params).iniData._M_h._M_rehash_policy = 0;
  (this->m_params).iniData._M_h._M_buckets = &(this->m_params).iniData._M_h._M_single_bucket;
  (this->m_params).iniData._M_h._M_bucket_count = 1;
  (this->m_params).iniData._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_params).iniData._M_h._M_element_count = 0;
  (this->m_params).iniData._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_params).iniData._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_params).iniData._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->m_params).currentGroup = (IniKeys *)0x0;
  (this->m_params).currentGroupName._M_dataplus._M_p =
       (pointer)&(this->m_params).currentGroupName.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&(this->m_params).currentGroupName,"");
  std::__cxx11::string::string((string *)local_38,iniFileName,&local_39);
  open(this,(char *)local_38,__oflag);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  return;
}

Assistant:

IniProcessing::IniProcessing(const char *iniFileName, int) :
    m_params
    {
        iniFileName, false, -1, ERR_OK, false, params::IniSections(), nullptr, ""
#ifdef _WIN32
        , false
#endif
    }
{
    open(iniFileName);
}